

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O2

string * aeron::archive::ChannelUri::addSessionId
                   (string *__return_storage_ptr__,string *channel,int32_t sessionId)

{
  ChannelUri channelUri;
  string local_c0;
  ChannelUri local_a0;
  
  parse(&local_a0,channel);
  std::__cxx11::to_string(&local_c0,sessionId);
  put(&local_a0,(string *)(anonymous_namespace)::SESSION_ID_PARAM_NAME_abi_cxx11_,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  toString_abi_cxx11_(__return_storage_ptr__,&local_a0);
  ~ChannelUri(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelUri::addSessionId(const std::string& channel, std::int32_t sessionId) {
    ChannelUri channelUri = ChannelUri::parse(channel);
    channelUri.put(SESSION_ID_PARAM_NAME, std::to_string(sessionId));
    return channelUri.toString();
}